

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match_unittest.cc
# Opt level: O0

void __thiscall
bssl::VerifyNameMatchInvalidDataTest_FailOnBadAttributeType_Test::
~VerifyNameMatchInvalidDataTest_FailOnBadAttributeType_Test
          (VerifyNameMatchInvalidDataTest_FailOnBadAttributeType_Test *this)

{
  VerifyNameMatchInvalidDataTest_FailOnBadAttributeType_Test *this_local;
  
  ~VerifyNameMatchInvalidDataTest_FailOnBadAttributeType_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(VerifyNameMatchInvalidDataTest, FailOnBadAttributeType) {
  std::string invalid;
  ASSERT_TRUE(LoadTestData("invalid", "AttributeTypeAndValue",
                           "badAttributeType", &invalid));
  // Verification should fail due to Attribute Type not being an OID.
  EXPECT_FALSE(VerifyNameMatch(SequenceValueFromString(invalid),
                               SequenceValueFromString(invalid)));
  std::string normalized_der;
  CertErrors errors;
  EXPECT_FALSE(NormalizeName(SequenceValueFromString(invalid), &normalized_der,
                             &errors));
}